

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_data.cpp
# Opt level: O3

uint16_t Get_Throttle(void)

{
  bool bVar1;
  uint16_t uVar2;
  unique_lock<std::timed_mutex> throttle_lock;
  unique_lock<std::timed_mutex> local_20;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  
  local_20._M_device = &Throttle_Mutex;
  local_20._M_owns = false;
  local_10.__r = 5;
  bVar1 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    (&local_20,&local_10);
  uVar2 = Throttle;
  if (bVar1) {
    std::unique_lock<std::timed_mutex>::unlock(&local_20);
  }
  else {
    uVar2 = 0;
  }
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_20);
  return uVar2;
}

Assistant:

bool Get_Run()
{
    return Run;
}